

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O0

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,PragmaFunction *function)

{
  long in_RDI;
  CreatePragmaFunctionInfo info;
  PragmaFunction *in_stack_fffffffffffffc98;
  PragmaFunction *in_stack_fffffffffffffca0;
  CreatePragmaFunctionInfo *this_00;
  CreatePragmaFunctionInfo *in_stack_fffffffffffffd20;
  Catalog *in_stack_fffffffffffffd28;
  CatalogTransaction in_stack_fffffffffffffd40;
  PragmaFunction *in_stack_fffffffffffffe28;
  CreatePragmaFunctionInfo *in_stack_fffffffffffffe30;
  
  PragmaFunction::PragmaFunction(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  CreatePragmaFunctionInfo::CreatePragmaFunctionInfo
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  PragmaFunction::~PragmaFunction(in_stack_fffffffffffffca0);
  this_00 = *(CreatePragmaFunctionInfo **)(in_RDI + 8);
  Catalog::CreatePragmaFunction
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd40,in_stack_fffffffffffffd20);
  CreatePragmaFunctionInfo::~CreatePragmaFunctionInfo(this_00);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(PragmaFunction function) {
	CreatePragmaFunctionInfo info(std::move(function));
	info.internal = true;
	catalog.CreatePragmaFunction(transaction, info);
}